

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  char cVar1;
  bool bVar2;
  ulong uVar3;
  char *pcVar4;
  size_t sVar5;
  long *plVar6;
  ostream *poVar7;
  int iVar8;
  long lVar9;
  content<mpt::item<mpt::layout::graph>_> *d;
  long *plVar10;
  color col;
  fpoint fp;
  const_iterator __begin2;
  const_iterator __end2;
  layout lay;
  char local_125;
  color local_124;
  point<float> local_120;
  char *local_118;
  undefined8 uStack_110;
  value local_108 [2];
  long local_e8;
  long local_e0;
  char **local_d8;
  long *local_d0;
  span<const_float> local_c8;
  char local_b8 [48];
  long local_88;
  long local_80;
  layout local_70 [32];
  long local_50;
  
  mtrace();
  mpt::layout::layout(local_70);
  if (argc < 2) {
    iVar8 = 1;
    mpt::warning("main","%s","missing layout argument");
  }
  else {
    cVar1 = mpt::layout::open((char *)local_70);
    if (cVar1 == '\0') {
      iVar8 = 2;
      mpt::error("main","%s: %s","unable to open layout",argv[1]);
    }
    else {
      mpt::logger::default_instance();
      cVar1 = mpt::layout::load((logger *)local_70);
      if (cVar1 == '\0') {
        iVar8 = 3;
        mpt::error("main","%s: %s","unable to load layout",argv[1]);
      }
      else {
        if (local_50 == 0) {
          plVar10 = (long *)0x0;
          uVar3 = 0;
        }
        else {
          plVar10 = (long *)(local_50 + 0x20);
          uVar3 = *(ulong *)(local_50 + 0x18) >> 5;
        }
        local_d8 = argv;
        if (uVar3 != 0) {
          local_d0 = plVar10 + uVar3 * 4;
          do {
            pcVar4 = (char *)mpt::identifier::name();
            if (pcVar4 == (char *)0x0) {
              std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x106098);
            }
            else {
              sVar5 = strlen(pcVar4);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar4,sVar5)
              ;
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," {",2);
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
            std::ostream::put(-0x68);
            std::ostream::flush();
            lVar9 = *plVar10;
            local_108[0]._addr = (void *)0x0;
            local_108[0]._type = 0;
            local_118 = (char *)0x0;
            uStack_110 = 0;
            mpt::property::set((char *)&local_118);
            lVar9 = lVar9 + 0x18;
            local_e0 = -1;
            local_e8 = lVar9;
            mpt::object::const_iterator::select((ulong)&local_118);
            local_b8[0x10] = '\0';
            local_b8[0x11] = '\0';
            local_b8[0x12] = '\0';
            local_b8[0x13] = '\0';
            local_b8[0x14] = '\0';
            local_b8[0x15] = '\0';
            local_b8[0x16] = '\0';
            local_b8[0x17] = '\0';
            local_b8[0x18] = '\0';
            local_b8[0x19] = '\0';
            local_b8[0x1a] = '\0';
            local_b8[0x1b] = '\0';
            local_b8[0x1c] = '\0';
            local_b8[0x1d] = '\0';
            local_b8[0x1e] = '\0';
            local_b8[0x1f] = '\0';
            local_b8[0] = '\0';
            local_b8[1] = '\0';
            local_b8[2] = '\0';
            local_b8[3] = '\0';
            local_b8[4] = '\0';
            local_b8[5] = '\0';
            local_b8[6] = '\0';
            local_b8[7] = '\0';
            local_b8[8] = '\0';
            local_b8[9] = '\0';
            local_b8[10] = '\0';
            local_b8[0xb] = '\0';
            local_b8[0xc] = '\0';
            local_b8[0xd] = '\0';
            local_b8[0xe] = '\0';
            local_b8[0xf] = '\0';
            mpt::property::set(local_b8);
            local_80 = -1;
            local_88 = lVar9;
            if ((local_e8 != lVar9) || (local_e0 != -1)) {
              do {
                local_124.alpha = 0xff;
                local_124.red = '\0';
                local_124.green = '\0';
                local_124.blue = '\0';
                bVar2 = mpt::value::get<mpt::color>(local_108,&local_124);
                if (bVar2) {
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  ",2);
                  pcVar4 = local_118;
                  if (local_118 == (char *)0x0) {
                    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x106098);
                  }
                  else {
                    sVar5 = strlen(local_118);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,pcVar4,sVar5);
                  }
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," = ",3);
                  plVar6 = (long *)operator<<((ostream *)&std::cout,&local_124);
                  std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
                  std::ostream::put((char)plVar6);
                  std::ostream::flush();
                }
                else {
                  local_120.x = 0.0;
                  local_120.y = 0.0;
                  bVar2 = mpt::value::get<mpt::fpoint>(local_108,(fpoint *)&local_120);
                  if (bVar2) {
                    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  ",2)
                    ;
                    pcVar4 = local_118;
                    if (local_118 == (char *)0x0) {
                      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x106098);
                    }
                    else {
                      sVar5 = strlen(local_118);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,pcVar4,sVar5);
                    }
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout," = [",4);
                    local_c8._base = &local_120.x;
                    local_c8._len = 8;
                    poVar7 = operator<<((ostream *)&std::cout,&local_c8);
                    local_125 = ']';
                    poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,&local_125,1)
                    ;
                    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
                    std::ostream::put((char)poVar7);
                    std::ostream::flush();
                  }
                  else {
                    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  ",2)
                    ;
                    pcVar4 = local_118;
                    if (local_118 == (char *)0x0) {
                      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x106098);
                    }
                    else {
                      sVar5 = strlen(local_118);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,pcVar4,sVar5);
                    }
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout," = ",3);
                    plVar6 = (long *)operator<<((ostream *)&std::cout,local_108);
                    std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
                    std::ostream::put((char)plVar6);
                    std::ostream::flush();
                  }
                }
                if (-1 < local_e0) {
                  cVar1 = mpt::object::const_iterator::select((ulong)&local_118);
                  if (cVar1 == '\0') {
                    local_118 = (char *)0x0;
                    local_e0 = -1;
                  }
                }
              } while ((local_e8 != local_88) || (local_e0 != local_80));
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"}",1);
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
            std::ostream::put(-0x68);
            std::ostream::flush();
            plVar10 = plVar10 + 4;
          } while (plVar10 != local_d0);
        }
        cVar1 = mpt::layout::reset();
        iVar8 = 0;
        if (cVar1 == '\0') {
          iVar8 = 4;
          mpt::error("main","%s: %s","unable to reset layout parser",local_d8[1]);
        }
      }
    }
  }
  mpt::layout::~layout(local_70);
  return iVar8;
}

Assistant:

extern int main(int argc, char *argv[])
{
	mtrace();
	
	mpt::layout lay;
	
	if (argc < 2) {
		mpt::warning(__func__, "%s", "missing layout argument");
		return 1;
	}
	if (!lay.open(argv[1])) {
		mpt::error(__func__, "%s: %s", "unable to open layout", argv[1]);
		return 2;
	}
	if (!lay.load()) {
		mpt::error(__func__, "%s: %s", "unable to load layout", argv[1]);
		return 3;
	}
	for (const mpt::item<mpt::layout::graph> &g : lay.graphs()) {
		std::cout << g.name() << " {" << std::endl;
		const mpt::object &o = *g.instance();
		for (const mpt::property &p : o) {
			mpt::color col;
			if (p.val.get(col)) {
				std::cout << "  " << p.name << " = " << col << std::endl;
				continue;
			}
			mpt::fpoint fp;
			if (p.val.get(fp)) {
				std::cout << "  " << p.name << " = [" << fp.span() << ']' << std::endl;
				continue;
			}
			std::cout << "  " << p.name << " = " << p.val << std::endl;
		}
		std::cout << "}" << std::endl;
	}
	if (!lay.reset()) {
		mpt::error(__func__, "%s: %s", "unable to reset layout parser", argv[1]);
		return 4;
	}
}